

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

long __thiscall
mkvparser::Cluster::CreateBlockGroup
          (Cluster *this,longlong start_offset,longlong size,longlong discard_padding)

{
  long *plVar1;
  IMkvReader *pReader;
  BlockEntry **ppBVar2;
  Cluster *pCluster;
  longlong lVar3;
  longlong size_00;
  long lVar4;
  BlockGroup *this_00;
  long lVar5;
  long lVar6;
  long local_78;
  longlong local_70;
  longlong local_68;
  longlong local_60;
  longlong local_58;
  long len;
  longlong local_48;
  Cluster *local_40;
  longlong time;
  
  pReader = this->m_pSegment->m_pReader;
  lVar6 = size + start_offset;
  local_70 = 1;
  local_68 = 0;
  local_60 = -1;
  local_78 = -1;
  local_58 = -1;
  local_48 = discard_padding;
  local_40 = this;
  while (pCluster = local_40, start_offset < lVar6) {
    lVar3 = ReadID(pReader,start_offset,&len);
    if (lVar3 < 0) {
      return -2;
    }
    lVar5 = start_offset + len;
    if (lVar6 < lVar5) {
      return -2;
    }
    size_00 = ReadUInt(pReader,lVar5,&len);
    lVar5 = lVar5 + len;
    if (lVar3 == 0x9b) {
      if (8 < size_00) {
        return -2;
      }
      local_58 = UnserializeUInt(pReader,lVar5,size_00);
      if (local_58 < 0) {
        return -2;
      }
    }
    else if (lVar3 == 0xfb) {
      if (size_00 - 9U < 0xfffffffffffffff8) {
        return -2;
      }
      lVar4 = UnserializeInt(pReader,lVar5,size_00,&time);
      lVar3 = time;
      if (time < 1) {
        local_70 = time;
        lVar3 = local_68;
      }
      local_68 = lVar3;
      if (lVar4 != 0) {
        return -1;
      }
    }
    else if ((lVar3 == 0xa1) && (local_78 < 0)) {
      local_78 = lVar5;
      local_60 = size_00;
    }
    start_offset = lVar5 + size_00;
    if (lVar6 < start_offset) {
      return -2;
    }
  }
  if (local_78 < 0) {
    return -2;
  }
  if (start_offset == lVar6) {
    ppBVar2 = local_40->m_entries;
    lVar6 = local_40->m_entries_count;
    this_00 = (BlockGroup *)operator_new(0x68,(nothrow_t *)&std::nothrow);
    if (this_00 == (BlockGroup *)0x0) {
      ppBVar2[lVar6] = (BlockEntry *)0x0;
      return -1;
    }
    BlockGroup::BlockGroup
              (this_00,pCluster,lVar6,local_78,local_60,local_70,local_68,local_58,local_48);
    ppBVar2[lVar6] = (BlockEntry *)this_00;
    lVar5 = BlockGroup::Parse(this_00);
    if (lVar5 == 0) {
      plVar1 = &pCluster->m_entries_count;
      *plVar1 = *plVar1 + 1;
      return 0;
    }
    if (ppBVar2[lVar6] != (BlockEntry *)0x0) {
      (*ppBVar2[lVar6]->_vptr_BlockEntry[1])();
    }
    ppBVar2[lVar6] = (BlockEntry *)0x0;
    return lVar5;
  }
  return -2;
}

Assistant:

long Cluster::CreateBlockGroup(long long start_offset, long long size,
                               long long discard_padding) {
  assert(m_entries);
  assert(m_entries_size > 0);
  assert(m_entries_count >= 0);
  assert(m_entries_count < m_entries_size);

  IMkvReader* const pReader = m_pSegment->m_pReader;

  long long pos = start_offset;
  const long long stop = start_offset + size;

  // For WebM files, there is a bias towards previous reference times
  //(in order to support alt-ref frames, which refer back to the previous
  // keyframe).  Normally a 0 value is not possible, but here we tenatively
  // allow 0 as the value of a reference frame, with the interpretation
  // that this is a "previous" reference time.

  long long prev = 1;  // nonce
  long long next = 0;  // nonce
  long long duration = -1;  // really, this is unsigned

  long long bpos = -1;
  long long bsize = -1;

  while (pos < stop) {
    long len;
    const long long id = ReadID(pReader, pos, len);
    if (id < 0 || (pos + len) > stop)
      return E_FILE_FORMAT_INVALID;

    pos += len;  // consume ID

    const long long size = ReadUInt(pReader, pos, len);
    assert(size >= 0);  // TODO
    assert((pos + len) <= stop);

    pos += len;  // consume size

    if (id == libwebm::kMkvBlock) {
      if (bpos < 0) {  // Block ID
        bpos = pos;
        bsize = size;
      }
    } else if (id == libwebm::kMkvBlockDuration) {
      if (size > 8)
        return E_FILE_FORMAT_INVALID;

      duration = UnserializeUInt(pReader, pos, size);

      if (duration < 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvReferenceBlock) {
      if (size > 8 || size <= 0)
        return E_FILE_FORMAT_INVALID;
      const long size_ = static_cast<long>(size);

      long long time;

      long status = UnserializeInt(pReader, pos, size_, time);
      assert(status == 0);
      if (status != 0)
        return -1;

      if (time <= 0)  // see note above
        prev = time;
      else
        next = time;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }
  if (bpos < 0)
    return E_FILE_FORMAT_INVALID;

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;
  assert(bsize >= 0);

  const long idx = m_entries_count;

  BlockEntry** const ppEntry = m_entries + idx;
  BlockEntry*& pEntry = *ppEntry;

  pEntry = new (std::nothrow)
      BlockGroup(this, idx, bpos, bsize, prev, next, duration, discard_padding);

  if (pEntry == NULL)
    return -1;  // generic error

  BlockGroup* const p = static_cast<BlockGroup*>(pEntry);

  const long status = p->Parse();

  if (status == 0) {  // success
    ++m_entries_count;
    return 0;
  }

  delete pEntry;
  pEntry = 0;

  return status;
}